

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::CompactReporter::testRunEnded(CompactReporter *this,TestRunStats *_testRunStats)

{
  ostream *this_00;
  StreamingReporterBase *in_RSI;
  TestRunStats *in_RDI;
  Totals *in_stack_000003d8;
  CompactReporter *in_stack_000003e0;
  
  printTotals(in_stack_000003e0,in_stack_000003d8);
  this_00 = std::operator<<(*(ostream **)&(in_RDI->runInfo).field_0x10,"\n");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  StreamingReporterBase::testRunEnded(in_RSI,in_RDI);
  return;
}

Assistant:

virtual void testRunEnded( TestRunStats const& _testRunStats ) {
            printTotals( _testRunStats.totals );
            stream << "\n" << std::endl;
            StreamingReporterBase::testRunEnded( _testRunStats );
        }